

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O2

string * __thiscall
cfd::core::ScriptOperator::ToString_abi_cxx11_(string *__return_storage_ptr__,ScriptOperator *this)

{
  iterator iVar1;
  allocator local_19;
  
  do {
    if ((this->text_data_)._M_string_length != 0) {
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->text_data_);
      return __return_storage_ptr__;
    }
    if (g_operator_map._40_8_ == 0) break;
    iVar1 = ::std::
            _Rb_tree<cfd::core::ScriptType,_std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>,_std::_Select1st<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>,_std::less<cfd::core::ScriptType>,_std::allocator<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>_>
            ::find((_Rb_tree<cfd::core::ScriptType,_std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>,_std::_Select1st<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>,_std::less<cfd::core::ScriptType>,_std::allocator<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>_>
                    *)g_operator_map,&this->data_type_);
    this = (ScriptOperator *)&iVar1._M_node[1]._M_parent;
  } while (iVar1._M_node != (_Base_ptr)(g_operator_map + 8));
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,"UNKNOWN",&local_19);
  return __return_storage_ptr__;
}

Assistant:

std::string ScriptOperator::ToString() const {
  if (text_data_.empty()) {
    if (!g_operator_map.empty()) {
      decltype(g_operator_map)::const_iterator ite =
          g_operator_map.find(data_type_);
      if (ite != g_operator_map.end()) {
        return ite->second.ToString();
      }
    }
    return "UNKNOWN";
  }
  return text_data_;
}